

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::tag<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  size_t sVar1;
  bool bVar2;
  __index_type *p_Var3;
  __index_type *__rhs;
  string_view expected;
  string local_120;
  undefined1 local_100 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  MaybeResult<wasm::WATParser::ImportNames> import;
  undefined1 local_90 [8];
  Result<wasm::Ok> type;
  size_t local_60;
  undefined1 local_58 [8];
  Result<wasm::Ok> _val_2;
  
  sVar1 = (ctx->in).pos;
  expected._M_str = "tag";
  expected._M_len = 3;
  bVar2 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar2) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_100,&ctx->in);
  if (exports.val.
      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
      super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._M_first._M_storage.
      _M_storage[8] == '\0') {
    type.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_index = '\0';
    type.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _33_7_ = 0;
    local_60 = 0;
  }
  else {
    type.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = exports.val.
             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
             super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._0_8_;
    local_60 = (size_t)local_100;
  }
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_100,&ctx->in)
  ;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                  (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_100);
  if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u._24_1_
      == '\x01') {
    std::__cxx11::string::string
              ((string *)local_90,
               (string *)
               ((long)&exports.val.
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)((long)&exports.val.
                                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20))
    ;
    goto LAB_00c077ae;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)((long)&exports.val.
                               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)
               ((long)&exports.val.
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),&ctx->in);
  __rhs = (__index_type *)
          ((long)&exports.val.
                  super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                  .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                  super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                  super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                  super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)local_90
             ,(_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)__rhs);
  if (type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x02') {
    std::__cxx11::string::string((string *)local_58,(string *)local_90);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_90);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_90);
    typeuse<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_90,ctx,true);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_58,
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_90);
    if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&import.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 + 0x20),(string *)local_58);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&import.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 + 0x20));
LAB_00c076aa:
      std::__cxx11::string::~string
                ((string *)
                 ((long)&import.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
      bVar2 = Lexer::takeRParen(&ctx->in);
      if (bVar2) {
        p_Var3 = local_100;
        if (exports.val.
            super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
            super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._24_1_ != '\0') {
          p_Var3 = (__index_type *)0x0;
        }
        if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u.
            _24_1_ != '\0') {
          __rhs = (__index_type *)0x0;
        }
        ParseDeclsCtx::addTag
                  (local_58,ctx,local_60,
                   type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,p_Var3,__rhs,(int)sVar1)
        ;
        if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&import.val.
                             super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                     + 0x20),(string *)local_58);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&import.val.
                              super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                      + 0x20));
          goto LAB_00c076aa;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"expected end of tag",
                   (allocator<char> *)
                   ((long)&import.val.
                           super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                   + 0x20));
        Lexer::err((Err *)local_58,&ctx->in,&local_120);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_58);
        std::__cxx11::string::~string((string *)local_58);
        std::__cxx11::string::~string((string *)&local_120);
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_90);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             ((long)&exports.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
LAB_00c077ae:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_100);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> tag(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("tag"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto type = typeuse(ctx);
  CHECK_ERR(type);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of tag");
  }

  CHECK_ERR(ctx.addTag(name, *exports, import.getPtr(), *type, pos));
  return Ok{};
}